

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * google::protobuf::compiler::js::(anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
                   (GeneratorOptions *options,FieldDescriptor *field)

{
  CppType CVar1;
  FileDescriptor *this;
  FieldDescriptor *in_RDX;
  string *in_RDI;
  Descriptor *in_stack_00000008;
  FileDescriptor *in_stack_00000010;
  GeneratorOptions *in_stack_00000018;
  LogMessage *in_stack_ffffffffffffff68;
  LogMessage *in_stack_ffffffffffffff70;
  LogMessage *in_stack_ffffffffffffff80;
  undefined1 local_50 [56];
  FieldDescriptor *local_18;
  
  local_18 = in_RDX;
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)0x46abc9);
  if (CVar1 != CPPTYPE_MESSAGE) {
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff80,(LogLevel)((ulong)local_50 >> 0x20),
               (char *)in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    internal::LogMessage::operator<<(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    internal::LogMessage::~LogMessage((LogMessage *)0x46ac38);
  }
  this = FieldDescriptor::file(local_18);
  FieldDescriptor::message_type((FieldDescriptor *)this);
  MaybeCrossFileRef_abi_cxx11_(in_stack_00000018,in_stack_00000010,in_stack_00000008);
  return in_RDI;
}

Assistant:

std::string SubmessageTypeRef(const GeneratorOptions& options,
                              const FieldDescriptor* field) {
  GOOGLE_CHECK(field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE);
  return MaybeCrossFileRef(options, field->file(), field->message_type());
}